

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::InstancingGroup::init
          (InstancingGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  undefined8 *puVar4;
  long *plVar5;
  TestNode *pTVar6;
  TestNode *node;
  long *extraout_RAX;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  string desc;
  string name;
  ostringstream s;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  undefined8 uStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  long *local_230;
  undefined8 local_228;
  long local_220;
  undefined8 uStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar9 = 0;
  local_1b0 = (TestNode *)this;
  do {
    local_270 = &local_260;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"draw_arrays_instanced_grid_","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c13870 + lVar9);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_270 != &local_260) {
      uVar8 = local_260;
    }
    if (uVar8 < (ulong)(local_208 + local_268)) {
      uVar8 = 0xf;
      if (local_210 != local_200) {
        uVar8 = local_200[0];
      }
      if (uVar8 < (ulong)(local_208 + local_268)) goto LAB_0125bfa6;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_0125bfa6:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210);
    }
    local_290 = &local_280;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_280 = *puVar7;
      lStack_278 = puVar4[3];
    }
    else {
      local_280 = *puVar7;
      local_290 = (ulong *)*puVar4;
    }
    local_288 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_250 = &local_240;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_240 = *puVar7;
      lStack_238 = plVar5[3];
    }
    else {
      local_240 = *puVar7;
      local_250 = (ulong *)*plVar5;
    }
    local_248 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_250 != &local_240) {
      uVar8 = local_240;
    }
    if (uVar8 < (ulong)(local_1e8 + local_248)) {
      uVar8 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar8 = local_1e0[0];
      }
      if (uVar8 < (ulong)(local_1e8 + local_248)) goto LAB_0125c0fb;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_250);
    }
    else {
LAB_0125c0fb:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_1f0);
    }
    local_230 = &local_220;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_220 = *plVar5;
      uStack_218 = puVar4[3];
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"DrawArraysInstanced, Grid size ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar8 < (ulong)(local_1e8 + local_208)) {
      uVar8 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar8 = local_1e0[0];
      }
      if (uVar8 < (ulong)(local_1e8 + local_208)) goto LAB_0125c2b6;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_0125c2b6:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_270 = &local_260;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_260 = *puVar7;
      uStack_258 = puVar4[3];
    }
    else {
      local_260 = *puVar7;
      local_270 = (ulong *)*puVar4;
    }
    local_268 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_290 = &local_280;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_280 = *puVar7;
      lStack_278 = plVar5[3];
    }
    else {
      local_280 = *puVar7;
      local_290 = (ulong *)*plVar5;
    }
    local_288 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if (uVar8 < (ulong)(local_1c8 + local_288)) {
      uVar8 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar8 = local_1c0[0];
      }
      if (uVar8 < (ulong)(local_1c8 + local_288)) goto LAB_0125c40e;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_0125c40e:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1d0);
    }
    local_250 = &local_240;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_240 = *puVar7;
      lStack_238 = puVar4[3];
    }
    else {
      local_240 = *puVar7;
      local_250 = (ulong *)*puVar4;
    }
    local_248 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,pCVar2->m_testCtx,(char *)local_230,(char *)local_250);
    pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021467c0;
    *(int *)&pTVar6[1].m_testCtx = iVar1;
    *(undefined1 *)((long)&pTVar6[1].m_testCtx + 4) = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    pTVar6 = local_1b0;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x14);
  lVar9 = 0;
  do {
    local_270 = &local_260;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"draw_elements_instanced_grid_","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c13870 + lVar9);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_270 != &local_260) {
      uVar8 = local_260;
    }
    if (uVar8 < (ulong)(local_208 + local_268)) {
      uVar8 = 0xf;
      if (local_210 != local_200) {
        uVar8 = local_200[0];
      }
      if (uVar8 < (ulong)(local_208 + local_268)) goto LAB_0125c679;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_0125c679:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210);
    }
    local_290 = &local_280;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_280 = *puVar7;
      lStack_278 = puVar4[3];
    }
    else {
      local_280 = *puVar7;
      local_290 = (ulong *)*puVar4;
    }
    local_288 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_250 = &local_240;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_240 = *puVar7;
      lStack_238 = plVar5[3];
    }
    else {
      local_240 = *puVar7;
      local_250 = (ulong *)*plVar5;
    }
    local_248 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_250 != &local_240) {
      uVar8 = local_240;
    }
    if (uVar8 < (ulong)(local_1e8 + local_248)) {
      uVar8 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar8 = local_1e0[0];
      }
      if (uVar8 < (ulong)(local_1e8 + local_248)) goto LAB_0125c7ce;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_250);
    }
    else {
LAB_0125c7ce:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_1f0);
    }
    local_230 = &local_220;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_220 = *plVar5;
      uStack_218 = puVar4[3];
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"DrawElementsInstanced, Grid size ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar8 < (ulong)(local_1e8 + local_208)) {
      uVar8 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar8 = local_1e0[0];
      }
      if (uVar8 < (ulong)(local_1e8 + local_208)) goto LAB_0125c989;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_0125c989:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_270 = &local_260;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_260 = *puVar7;
      uStack_258 = puVar4[3];
    }
    else {
      local_260 = *puVar7;
      local_270 = (ulong *)*puVar4;
    }
    local_268 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_290 = &local_280;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_280 = *puVar7;
      lStack_278 = plVar5[3];
    }
    else {
      local_280 = *puVar7;
      local_290 = (ulong *)*plVar5;
    }
    local_288 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if (uVar8 < (ulong)(local_1c8 + local_288)) {
      uVar8 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar8 = local_1c0[0];
      }
      if (uVar8 < (ulong)(local_1c8 + local_288)) goto LAB_0125cae1;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_0125cae1:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1d0);
    }
    local_250 = &local_240;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_240 = *puVar7;
      lStack_238 = puVar4[3];
    }
    else {
      local_240 = *puVar7;
      local_250 = (ulong *)*puVar4;
    }
    local_248 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    node = (TestNode *)operator_new(0x80);
    pp_Var3 = pTVar6[1]._vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)node,(TestContext *)*pp_Var3,(char *)local_230,(char *)local_250);
    node[1]._vptr_TestNode = pp_Var3;
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021467c0;
    *(int *)&node[1].m_testCtx = iVar1;
    *(undefined1 *)((long)&node[1].m_testCtx + 4) = 1;
    tcu::TestNode::addChild(pTVar6,node);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    plVar5 = &local_220;
    if (local_230 != plVar5) {
      operator_delete(local_230,local_220 + 1);
      plVar5 = extraout_RAX;
    }
    lVar9 = lVar9 + 4;
    if (lVar9 == 0x14) {
      return (int)plVar5;
    }
  } while( true );
}

Assistant:

void InstancingGroup::init (void)
{
	const int gridWidths[] =
	{
		2,
		5,
		10,
		32,
		100,
	};

	// drawArrays
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_arrays_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawArraysInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], false));
	}

	// drawElements
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_elements_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawElementsInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], true));
	}
}